

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_verify.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  yajl_status yVar2;
  yajl_handle h;
  size_t sVar3;
  yajl_handle pyVar4;
  uchar *puVar5;
  long in_RSI;
  char *pcVar6;
  int in_EDI;
  uchar *str;
  uint i;
  int a;
  int retval;
  int quiet;
  yajl_handle hand;
  size_t rd;
  yajl_status stat;
  uchar *in_stack_ffffffffffffffa8;
  yajl_handle in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  yajl_handle in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar7;
  int iVar8;
  int iVar9;
  yajl_callbacks *in_stack_ffffffffffffffd8;
  
  iVar9 = 0;
  iVar8 = 1;
  h = yajl_alloc(in_stack_ffffffffffffffd8,(yajl_alloc_funcs *)0x0,
                 (void *)CONCAT44(1,in_stack_ffffffffffffffc8));
  while( true ) {
    uVar7 = in_stack_ffffffffffffffbc & 0xffffff;
    if ((iVar8 < in_EDI) &&
       (uVar7 = in_stack_ffffffffffffffbc & 0xffffff, **(char **)(in_RSI + (long)iVar8 * 8) == '-'))
    {
      sVar3 = strlen(*(char **)(in_RSI + (long)iVar8 * 8));
      uVar7 = CONCAT13(1 < sVar3,(int3)uVar7);
    }
    in_stack_ffffffffffffffbc = uVar7;
    if ((char)(in_stack_ffffffffffffffbc >> 0x18) == '\0') break;
    uVar7 = 1;
    while( true ) {
      in_stack_ffffffffffffffb0 = (yajl_handle)(ulong)uVar7;
      pyVar4 = (yajl_handle)strlen(*(char **)(in_RSI + (long)iVar8 * 8));
      if (pyVar4 <= in_stack_ffffffffffffffb0) break;
      in_stack_ffffffffffffffa8 =
           (uchar *)(ulong)((int)*(char *)(*(long *)(in_RSI + (long)iVar8 * 8) + (ulong)uVar7) - 99)
      ;
      switch(in_stack_ffffffffffffffa8) {
      case (uchar *)0x0:
        yajl_config(h,yajl_allow_comments);
        break;
      default:
        fprintf(_stderr,"unrecognized option: \'%c\'\n\n",
                (ulong)(uint)(int)*(char *)(*(long *)(in_RSI + (long)iVar8 * 8) + (ulong)uVar7));
        usage((char *)0x1023b2);
        break;
      case (uchar *)0xe:
        iVar9 = 1;
        break;
      case (uchar *)0x10:
        yajl_config(h,yajl_allow_multiple_values,1);
        break;
      case (uchar *)0x12:
        yajl_config(h,yajl_dont_validate_strings,1);
      }
      uVar7 = uVar7 + 1;
    }
    iVar8 = iVar8 + 1;
  }
  if (iVar8 < in_EDI) {
    usage((char *)0x1023eb);
  }
  do {
    sVar3 = fread(main::fileData,1,0xffff,_stdin);
    iVar8 = 0;
    if (sVar3 == 0) {
      iVar1 = feof(_stdin);
      if (iVar1 == 0) {
        if (iVar9 == 0) {
          fprintf(_stderr,"error encountered on file read\n");
        }
        iVar8 = 1;
      }
      break;
    }
    main::fileData[sVar3] = '\0';
    yVar2 = yajl_parse(in_stack_ffffffffffffffc0,
                       (uchar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (size_t)in_stack_ffffffffffffffb0);
  } while (yVar2 == yajl_status_ok);
  yVar2 = yajl_complete_parse((yajl_handle)0x1024a1);
  if (yVar2 != yajl_status_ok) {
    if (iVar9 == 0) {
      puVar5 = yajl_get_error(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                              (uchar *)in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
      fprintf(_stderr,"%s",puVar5);
      yajl_free_error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    iVar8 = 1;
  }
  yajl_free((yajl_handle)0x102511);
  if (iVar9 == 0) {
    pcVar6 = "valid";
    if (iVar8 != 0) {
      pcVar6 = "invalid";
    }
    printf("JSON is %s\n",pcVar6);
  }
  return iVar8;
}

Assistant:

int
main(int argc, char ** argv)
{
    yajl_status stat;
    size_t rd;
    yajl_handle hand;
    static unsigned char fileData[65536];
    int quiet = 0;
    int retval = 0;
    int a = 1;

    /* allocate a parser */
    hand = yajl_alloc(NULL, NULL, NULL);

    /* check arguments.*/
    while ((a < argc) && (argv[a][0] == '-') && (strlen(argv[a]) > 1)) {
        unsigned int i;
        for ( i=1; i < strlen(argv[a]); i++) {
            switch (argv[a][i]) {
                case 'q':
                    quiet = 1;
                    break;
                case 'c':
                    yajl_config(hand, yajl_allow_comments, 1);
                    break;
                case 'u':
                    yajl_config(hand, yajl_dont_validate_strings, 1);
                    break;
                case 's':
                    yajl_config(hand, yajl_allow_multiple_values, 1);
                    break;
                default:
                    fprintf(stderr, "unrecognized option: '%c'\n\n", argv[a][i]);
                    usage(argv[0]);
            }
        }
        ++a;
    }
    if (a < argc) {
        usage(argv[0]);
    }

    for (;;) {
        rd = fread((void *) fileData, 1, sizeof(fileData) - 1, stdin);

        retval = 0;

        if (rd == 0) {
            if (!feof(stdin)) {
                if (!quiet) {
                    fprintf(stderr, "error encountered on file read\n");
                }
                retval = 1;
            }
            break;
        }
        fileData[rd] = 0;

        /* read file data, pass to parser */
        stat = yajl_parse(hand, fileData, rd);

        if (stat != yajl_status_ok) break;
    }

    /* parse any remaining buffered data */
    stat = yajl_complete_parse(hand);

    if (stat != yajl_status_ok)
    {
        if (!quiet) {
            unsigned char * str = yajl_get_error(hand, 1, fileData, rd);
            fprintf(stderr, "%s", (const char *) str);
            yajl_free_error(hand, str);
        }
        retval = 1;
    }

    yajl_free(hand);

    if (!quiet) {
        printf("JSON is %s\n", retval ? "invalid" : "valid");
    }

    return retval;
}